

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutitem.cpp
# Opt level: O1

bool __thiscall QWidgetItem::isEmpty(QWidgetItem *this)

{
  QSizePolicy QVar1;
  
  if (((this->wid->data->widget_attributes & 0x10000) != 0) &&
     (QVar1 = QWidget::sizePolicy(this->wid), -1 < (int)QVar1.field_0)) {
    return true;
  }
  return (bool)((byte)(this->wid->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                      super_QFlagsStorage<Qt::WindowType>.i & 1);
}

Assistant:

bool QWidgetItem::isEmpty() const
{
    return (wid->isHidden() && !wid->sizePolicy().retainSizeWhenHidden()) || wid->isWindow();
}